

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool S2BooleanOperation::IsEmpty(OpType op_type,S2ShapeIndex *a,S2ShapeIndex *b,Options *options)

{
  bool bVar1;
  ostream *poVar2;
  S2LogMessage local_d8;
  S2LogMessageVoidify local_c5 [13];
  undefined1 local_b8 [8];
  S2Error error;
  S2BooleanOperation op;
  bool result_empty;
  Options *options_local;
  S2ShapeIndex *b_local;
  S2ShapeIndex *a_local;
  OpType op_type_local;
  
  S2BooleanOperation((S2BooleanOperation *)&error.field_0x20,op_type,
                     (bool *)((long)&op.result_empty_ + 7),options);
  S2Error::S2Error((S2Error *)local_b8);
  Build((S2BooleanOperation *)&error.field_0x20,a,b,(S2Error *)local_b8);
  bVar1 = S2Error::ok((S2Error *)local_b8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    S2Error::~S2Error((S2Error *)local_b8);
    ~S2BooleanOperation((S2BooleanOperation *)&error.field_0x20);
    return (bool)(op.result_empty_._7_1_ & 1);
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
             ,0x955,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_d8);
  poVar2 = std::operator<<(poVar2,"Check failed: error.ok() ");
  S2LogMessageVoidify::operator&(local_c5,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_d8);
}

Assistant:

bool S2BooleanOperation::IsEmpty(
    OpType op_type, const S2ShapeIndex& a, const S2ShapeIndex& b,
    const Options& options) {
  bool result_empty;
  S2BooleanOperation op(op_type, &result_empty, options);
  S2Error error;
  op.Build(a, b, &error);
  S2_DCHECK(error.ok());
  return result_empty;
}